

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection-visitor.hpp
# Opt level: O1

void miyuki::refl::
     accept<miyuki::serialize::AutoLoadVisitor,24ul,int,int,int,std::shared_ptr<Bar>,std::shared_ptr<Bar>,std::vector<std::shared_ptr<Bar>,std::allocator<std::shared_ptr<Bar>>>>
               (AutoLoadVisitor visitor,char (*args_s) [24],int *args,int *args_1,int *args_2,
               shared_ptr<Bar> *args_3,shared_ptr<Bar> *args_4,
               vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_> *args_5)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  long *plVar7;
  ulong uVar8;
  char *a [6];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL> array;
  long *local_168;
  ulong local_160;
  long local_158 [2];
  int *local_148;
  int *local_140;
  shared_ptr<Bar> *local_138;
  int *local_130;
  char *local_128 [7];
  undefined8 local_f0 [2];
  undefined1 local_e0 [144];
  long local_50 [4];
  
  local_168 = local_158;
  local_148 = args_1;
  local_140 = args_2;
  local_138 = args_3;
  local_130 = args;
  sVar3 = strlen(*args_s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,args_s,*args_s + sVar3);
  lVar4 = 0x10;
  do {
    *(undefined1 **)((long)local_128 + lVar4 + 0x28) = (undefined1 *)((long)local_f0 + lVar4);
    *(undefined8 *)((long)local_128 + lVar4 + 0x30) = 0;
    *(undefined1 *)((long)local_f0 + lVar4) = 0;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0xd0);
  lVar4 = 0;
  uVar5 = 0;
  do {
    uVar8 = local_160;
    plVar7 = local_168;
    uVar6 = uVar5;
    if (uVar5 < local_160) {
      do {
        iVar2 = isspace((int)*(char *)((long)plVar7 + uVar5));
        uVar6 = uVar5;
        if (iVar2 == 0) break;
        uVar5 = uVar5 + 1;
        uVar6 = uVar8;
      } while (uVar8 != uVar5);
    }
    uVar8 = uVar6;
    for (; (uVar1 = local_160, plVar7 = local_168, uVar8 = uVar8 + 1, uVar6 < local_160 &&
           (*(char *)((long)local_168 + uVar6) != ',')); uVar6 = uVar6 + 1) {
      std::__cxx11::string::push_back((char)local_158 + (char)lVar4 * ' ' + 'h');
    }
    do {
      uVar5 = uVar8;
      if (uVar1 <= uVar5) break;
      iVar2 = isspace((int)*(char *)((long)plVar7 + uVar5));
      uVar8 = uVar5 + 1;
    } while (iVar2 != 0);
    lVar4 = lVar4 + 1;
    if (lVar4 == 6) {
      lVar4 = 0;
      do {
        *(undefined8 *)((long)local_128 + lVar4) = *(undefined8 *)((long)local_f0 + lVar4 * 4);
        lVar4 = lVar4 + 8;
      } while (lVar4 != 0x30);
      serialize::InputArchive::_load_nvp<int>(visitor.ar,local_128[0],local_130);
      accept<miyuki::serialize::AutoLoadVisitor,int,int,std::shared_ptr<Bar>,std::shared_ptr<Bar>,std::vector<std::shared_ptr<Bar>,std::allocator<std::shared_ptr<Bar>>>>
                (visitor,local_128 + 1,local_148,local_140,local_138,args_4,args_5);
      lVar4 = -0xc0;
      plVar7 = local_50 + 2;
      do {
        if (plVar7 != (long *)plVar7[-2]) {
          operator_delete((long *)plVar7[-2],*plVar7 + 1);
        }
        plVar7 = plVar7 + -4;
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != 0);
      if (local_168 != local_158) {
        operator_delete(local_168,local_158[0] + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void accept(Visitor visitor, const char (&args_s)[N], Args &... args) {
        std::string s = args_s;
        std::array<std::string, sizeof...(Args)> array;
        size_t pos = 0;
        for (size_t i = 0; i < array.size(); i++) {
            while (pos < s.length() && isspace(s[pos])) {
                pos++;
            }
            while (pos < s.length() && s[pos] != ',')
                array[i] += s[pos++];
            pos++;
            while (pos < s.length() && isspace(s[pos])) {
                pos++;
            }
        }
        const char *a[sizeof...(Args)];
        for (size_t i = 0; i < array.size(); i++) {
            a[i] = array[i].c_str();
        }
        accept<Visitor, Args...>(visitor, a, args...);
    }